

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CETime.cpp
# Opt level: O3

void __thiscall CETime::CETime(CETime *this)

{
  this->_vptr_CETime = (_func_int **)&PTR__CETime_00165d18;
  std::vector<double,_std::allocator<double>_>::vector(&this->time_);
  init_members(this);
  return;
}

Assistant:

CETime::CETime()
{
    init_members();
}